

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O1

qint64 __thiscall
QUdpSocket::writeDatagram
          (QUdpSocket *this,char *data,qint64 size,QHostAddress *address,quint16 port)

{
  char16_t **this_00;
  QAbstractSocketPrivate *this_01;
  QAbstractSocketEngine *pQVar1;
  bool bVar2;
  SocketState SVar3;
  SocketError errorCode;
  qint64 qVar4;
  qintptr qVar5;
  socklen_t __len;
  QHostAddress *pQVar6;
  long in_FS_OFFSET;
  QString local_60;
  undefined4 local_48;
  undefined2 local_44;
  quint16 local_42;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractSocketPrivate **)&(this->super_QAbstractSocket).field_0x8;
  QHostAddress::QHostAddress((QHostAddress *)&local_60,Any);
  pQVar6 = address;
  bVar2 = QUdpSocketPrivate::doEnsureInitialized
                    ((QUdpSocketPrivate *)this_01,(QHostAddress *)&local_60,0,address);
  __len = (socklen_t)pQVar6;
  QHostAddress::~QHostAddress((QHostAddress *)&local_60);
  qVar4 = -1;
  if (bVar2) {
    SVar3 = QAbstractSocket::state(&this->super_QAbstractSocket);
    if (SVar3 == UnconnectedState) {
      QAbstractSocket::bind(&this->super_QAbstractSocket,0,(sockaddr *)0x0,__len);
    }
    pQVar1 = this_01->socketEngine;
    QHostAddress::QHostAddress((QHostAddress *)&local_60);
    this_00 = &local_60.d.ptr;
    QHostAddress::QHostAddress((QHostAddress *)this_00,address);
    local_60.d.size = -0x100000000;
    local_48 = 0xffffffff;
    local_44 = 0;
    local_40 = 0;
    local_42 = port;
    qVar4 = (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1,data,size,&local_60);
    QHostAddress::~QHostAddress((QHostAddress *)this_00);
    QHostAddress::~QHostAddress((QHostAddress *)&local_60);
    qVar5 = (**(code **)(*(long *)this_01->socketEngine + 0x70))();
    this_01->cachedSocketDescriptor = qVar5;
    if (qVar4 < 0) {
      if (qVar4 == -2) {
        QMetaObject::tr((char *)&local_60,(char *)&staticMetaObject,0x266f58);
        QAbstractSocketPrivate::setErrorAndEmit(this_01,TemporaryError,&local_60);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        qVar4 = -1;
      }
      else {
        errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_01->socketEngine);
        QAbstractSocketEngine::errorString(&local_60,(QAbstractSocketEngine *)this_01->socketEngine)
        ;
        QAbstractSocketPrivate::setErrorAndEmit(this_01,errorCode,&local_60);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      QIODevice::bytesWritten((longlong)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar4;
}

Assistant:

qint64 QUdpSocket::writeDatagram(const char *data, qint64 size, const QHostAddress &address,
                                  quint16 port)
{
    Q_D(QUdpSocket);
#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::writeDatagram(%p, %llu, \"%s\", %i)", data, size,
           address.toString().toLatin1().constData(), port);
#endif
    if (!d->doEnsureInitialized(QHostAddress::Any, 0, address))
        return -1;
    if (state() == UnconnectedState)
        bind();

    qint64 sent = d->socketEngine->writeDatagram(data, size, QIpPacketHeader(address, port));
    d->cachedSocketDescriptor = d->socketEngine->socketDescriptor();

    if (sent >= 0) {
        emit bytesWritten(sent);
    } else {
        if (sent == -2) {
            // Socket engine reports EAGAIN. Treat as a temporary error.
            d->setErrorAndEmit(QAbstractSocket::TemporaryError,
                               tr("Unable to send a datagram"));
            return -1;
        }
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return sent;
}